

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada_info.h
# Opt level: O2

void __thiscall CGL::Collada::Node::Node(Node *this)

{
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->instance = (Instance *)0x0;
  Matrix4x4::identity();
  return;
}

Assistant:

Node() : instance(nullptr), transform( Matrix4x4::identity() ) { }